

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O1

long LocaleIndependentAtoi<long>(string_view str)

{
  void *pvVar1;
  size_type sVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<long> _Var7;
  long result;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  long local_30;
  
  pcVar4 = str._M_str;
  uVar6 = str._M_len;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0xffffffffffffffff;
  local_40._M_len = uVar6;
  local_40._M_str = pcVar4;
  if (uVar6 != 0) {
    uVar5 = 0;
    do {
      pvVar1 = memchr(" \f\n\r\t\v",(int)pcVar4[uVar5],6);
      uVar3 = uVar5;
      if (pvVar1 == (void *)0x0) break;
      uVar5 = uVar5 + 1;
      uVar3 = 0xffffffffffffffff;
    } while (uVar6 != uVar5);
  }
  if (uVar3 == 0xffffffffffffffff) {
    uVar6 = 0;
    pcVar4 = (char *)0x0;
  }
  else {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                      (&local_40," \f\n\r\t\v",0xffffffffffffffff,6);
    if (local_40._M_len < uVar3) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar3);
      }
      goto LAB_0075d19a;
    }
    uVar6 = (sVar2 - uVar3) + 1;
    if (local_40._M_len - uVar3 < uVar6) {
      uVar6 = local_40._M_len - uVar3;
    }
    pcVar4 = local_40._M_str + uVar3;
  }
  if ((uVar6 == 0) || (*pcVar4 != '+')) {
LAB_0075d113:
    _Var7 = std::from_chars<long>(pcVar4,pcVar4 + uVar6,(long *)&local_40,10);
    uVar3 = local_40._M_len;
    if (_Var7.ec != 0) {
      if (_Var7.ec != result_out_of_range) goto LAB_0075d14b;
      uVar3 = 0x7fffffffffffffff;
      if ((uVar6 != 0) && (*pcVar4 == '-')) {
        uVar3 = 0x8000000000000000;
      }
    }
  }
  else {
    if ((uVar6 == 1) || (pcVar4[1] != '-')) {
      uVar6 = uVar6 - 1;
      pcVar4 = pcVar4 + 1;
      goto LAB_0075d113;
    }
LAB_0075d14b:
    uVar3 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return uVar3;
  }
LAB_0075d19a:
  __stack_chk_fail();
}

Assistant:

T LocaleIndependentAtoi(std::string_view str)
{
    static_assert(std::is_integral<T>::value);
    T result;
    // Emulate atoi(...) handling of white space and leading +/-.
    std::string_view s = util::TrimStringView(str);
    if (!s.empty() && s[0] == '+') {
        if (s.length() >= 2 && s[1] == '-') {
            return 0;
        }
        s = s.substr(1);
    }
    auto [_, error_condition] = std::from_chars(s.data(), s.data() + s.size(), result);
    if (error_condition == std::errc::result_out_of_range) {
        if (s.length() >= 1 && s[0] == '-') {
            // Saturate underflow, per strtoll's behavior.
            return std::numeric_limits<T>::min();
        } else {
            // Saturate overflow, per strtoll's behavior.
            return std::numeric_limits<T>::max();
        }
    } else if (error_condition != std::errc{}) {
        return 0;
    }
    return result;
}